

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin.cpp
# Opt level: O2

void __thiscall
flatbuffers::kotlin::KotlinGenerator::GenerateStartVectorField
          (KotlinGenerator *this,FieldDef *field,CodeWriter *writer,IDLOptions *options)

{
  size_t sVar1;
  allocator<char> local_104;
  allocator<char> local_103;
  allocator<char> local_102;
  allocator<char> local_101;
  string local_100;
  string local_e0;
  allocator<char> local_c0 [32];
  Type local_a0;
  string local_80;
  string local_60;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_a0.base_type = (field->value).type.element;
  local_a0.fixed_length = (field->value).type.fixed_length;
  local_a0.element = BASE_TYPE_NONE;
  local_a0.struct_def = (field->value).type.struct_def;
  local_a0.enum_def = (field->value).type.enum_def;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"size",local_c0);
  sVar1 = InlineSize(&local_a0);
  NumToString<unsigned_long>(&local_100,sVar1);
  CodeWriter::SetValue(writer,&local_e0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"align",local_c0);
  sVar1 = InlineAlignment(&local_a0);
  NumToString<unsigned_long>(&local_100,sVar1);
  CodeWriter::SetValue(writer,&local_e0,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"start",&local_101);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_c0,"Vector",&local_102);
  (*(this->namer_).super_Namer._vptr_Namer[2])(&local_e0,&this->namer_,&local_100,field,local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"builder: FlatBufferBuilder, numElems: Int",&local_103);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_104);
  local_40._8_8_ = 0;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin.cpp:732:9)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_kotlin.cpp:732:9)>
             ::_M_manager;
  local_40._M_unused._M_object = writer;
  GenerateFunOneLine(writer,&local_e0,&local_60,&local_80,(function<void_()> *)&local_40,
                     options->gen_jvmstatic);
  std::_Function_base::~_Function_base((_Function_base *)&local_40);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)&local_100);
  return;
}

Assistant:

void GenerateStartVectorField(FieldDef &field, CodeWriter &writer,
                                const IDLOptions options) const {
    // Generate a method to start a vector, data to be added manually
    // after.
    auto vector_type = field.value.type.VectorType();
    auto params = "builder: FlatBufferBuilder, numElems: Int";
    writer.SetValue("size", NumToString(InlineSize(vector_type)));
    writer.SetValue("align", NumToString(InlineAlignment(vector_type)));

    GenerateFunOneLine(
        writer, namer_.Method("start", field, "Vector"), params, "",
        [&]() {
          writer += "builder.startVector({{size}}, numElems, {{align}})";
        },
        options.gen_jvmstatic);
  }